

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode)

{
  Tables *pTVar1;
  bool bVar2;
  string *psVar3;
  long lVar4;
  FileDescriptor *__s;
  SourceCodeInfo *pSVar5;
  FileOptions *pFVar6;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar7;
  EnumOptions *pEVar8;
  undefined8 *puVar9;
  MessageOptions *pMVar10;
  EnumValueOptions *pEVar11;
  DescriptorBuilder *this_00;
  ulong uVar12;
  Symbol SVar13;
  allocator<char> local_69;
  string local_68;
  string *local_48;
  string *local_40;
  string *local_38;
  
  this_00 = this;
  SVar13 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode);
  aVar7 = SVar13.field_1;
  if (SVar13.type == NULL_SYMBOL) {
    uVar12 = 0;
    if (this->pool_->allow_unknown_ == true) {
      bVar2 = ValidateQualifiedName(this_00,name);
      if (bVar2) {
        pTVar1 = this->tables_;
        if (*(name->_M_dataplus)._M_p == '.') {
          std::__cxx11::string::substr((ulong)&local_68,(ulong)name);
          psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
        else {
          psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,name);
        }
        lVar4 = std::__cxx11::string::rfind((char)psVar3,0x2e);
        local_38 = psVar3;
        if (lVar4 == -1) {
          local_40 = (string *)(anonymous_namespace)::kEmptyString_abi_cxx11_;
          local_48 = psVar3;
        }
        else {
          pTVar1 = this->tables_;
          std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar3);
          local_40 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          pTVar1 = this->tables_;
          std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar3);
          local_48 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
        psVar3 = local_38;
        __s = DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>(this->tables_);
        memset(__s,0,0xa0);
        pSVar5 = SourceCodeInfo::default_instance();
        *(SourceCodeInfo **)(__s + 0x98) = pSVar5;
        pTVar1 = this->tables_;
        std::operator+(&local_68,psVar3,".placeholder.proto");
        psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
        *(string **)__s = psVar3;
        std::__cxx11::string::~string((string *)&local_68);
        *(string **)(__s + 8) = local_40;
        *(DescriptorPool **)(__s + 0x10) = this->pool_;
        pFVar6 = FileOptions::default_instance();
        *(FileOptions **)(__s + 0x88) = pFVar6;
        *(undefined1 **)(__s + 0x90) = FileDescriptorTables::kEmpty;
        if (placeholder_type == PLACEHOLDER_ENUM) {
          *(undefined4 *)(__s + 0x58) = 1;
          aVar7.descriptor = (Descriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x38)
          ;
          ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(__s + 0x60))->descriptor = (Descriptor *)aVar7;
          *(undefined8 *)(aVar7.descriptor + 0x18) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x20) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x28) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x30) = 0;
          *(string **)(aVar7.descriptor + 8) = local_38;
          *(string **)aVar7.descriptor = local_48;
          *(FileDescriptor **)(aVar7.descriptor + 0x10) = __s;
          pEVar8 = EnumOptions::default_instance();
          *(EnumOptions **)(aVar7.descriptor + 0x20) = pEVar8;
          aVar7.descriptor[0x28] = (Descriptor)0x1;
          aVar7.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
          *(undefined4 *)(aVar7.descriptor + 0x2c) = 1;
          puVar9 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x28);
          *(undefined8 **)(aVar7.descriptor + 0x30) = puVar9;
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar9[2] = 0;
          puVar9[3] = 0;
          puVar9[4] = 0;
          pTVar1 = this->tables_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"PLACEHOLDER_VALUE",&local_69);
          psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
          *puVar9 = psVar3;
          std::__cxx11::string::~string((string *)&local_68);
          if (local_40->_M_string_length == 0) {
            puVar9[1] = *puVar9;
          }
          else {
            pTVar1 = this->tables_;
            std::operator+(&local_68,local_40,".PLACEHOLDER_VALUE");
            psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
            puVar9[1] = psVar3;
            std::__cxx11::string::~string((string *)&local_68);
          }
          *(undefined4 *)(puVar9 + 2) = 0;
          ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar9 + 3))->descriptor = (Descriptor *)aVar7;
          pEVar11 = EnumValueOptions::default_instance();
          puVar9[4] = pEVar11;
          uVar12 = 3;
        }
        else {
          *(undefined4 *)(__s + 0x48) = 1;
          aVar7.descriptor = (Descriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x78)
          ;
          ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(__s + 0x50))->descriptor = (Descriptor *)aVar7;
          *(undefined8 *)(aVar7.descriptor + 0x18) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x20) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x28) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x30) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x38) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x40) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x48) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x50) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x58) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x60) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x68) = 0;
          *(undefined8 *)(aVar7.descriptor + 0x70) = 0;
          *(string **)(aVar7.descriptor + 8) = local_38;
          *(string **)aVar7.descriptor = local_48;
          *(FileDescriptor **)(aVar7.descriptor + 0x10) = __s;
          pMVar10 = MessageOptions::default_instance();
          *(MessageOptions **)(aVar7.descriptor + 0x20) = pMVar10;
          aVar7.descriptor[0x28] = (Descriptor)0x1;
          aVar7.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
          uVar12 = 1;
          if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
            *(undefined4 *)(aVar7.descriptor + 0x58) = 1;
            puVar9 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,8);
            *(undefined8 **)(aVar7.descriptor + 0x60) = puVar9;
            *puVar9 = 0x2000000000000001;
          }
        }
      }
      else {
        uVar12 = (ulong)(anonymous_namespace)::kNullSymbol;
        aVar7 = DAT_0029a628;
      }
    }
  }
  else {
    uVar12 = (ulong)SVar13.type;
  }
  SVar13.field_1.descriptor = aVar7.descriptor;
  SVar13._0_8_ = uVar12;
  return SVar13;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const string& name, const string& relative_to,
    PlaceholderType placeholder_type, ResolveMode resolve_mode) {
  Symbol result = LookupSymbolNoPlaceholder(
      name, relative_to, resolve_mode);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = NewPlaceholder(name, placeholder_type);
  }
  return result;
}